

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O3

void __thiscall
QtMWidgets::ScrollIndicator::drawIndicator(ScrollIndicator *this,QPainter *p,QColor *c)

{
  int iVar1;
  QColor paintColor;
  QBrush local_40 [8];
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  QColor local_28;
  
  if (this->policy != ScrollIndicatorAlwaysOff) {
    local_28._0_8_ = *(undefined8 *)c;
    local_28._8_8_ = *(undefined8 *)((long)&c->ct + 4);
    if ((this->policy != ScrollIndicatorAlwaysOn) && (this->animate != false)) {
      QColor::setAlpha((int)&local_28);
    }
    QBrush::QBrush(local_40,&local_28,SolidPattern);
    QPen::QPen(SUB84((double)this->width,0),&local_38,local_40,1,0x20,0x40);
    QPainter::setPen((QPen *)p);
    QPen::~QPen((QPen *)&local_38);
    QBrush::~QBrush(local_40);
    local_2c = this->size;
    iVar1 = this->width / 2;
    if (this->orientation == Horizontal) {
      local_38 = 0;
      local_34 = iVar1;
      local_30 = local_2c;
      local_2c = iVar1;
    }
    else {
      local_34 = 0;
      local_38 = iVar1;
      local_30 = iVar1;
    }
    QPainter::drawLines((QLine *)p,(int)&local_38);
  }
  return;
}

Assistant:

void
ScrollIndicator::drawIndicator( QPainter * p, const QColor & c )
{
	if( policy != AbstractScrollArea::ScrollIndicatorAlwaysOff )
	{
		QColor paintColor = c;

		if( animate && policy != AbstractScrollArea::ScrollIndicatorAlwaysOn )
			paintColor.setAlpha( alpha );

		p->setPen( QPen( paintColor, width, Qt::SolidLine, Qt::RoundCap ) );

		const int middle = width / 2;

		if( orientation == Qt::Horizontal )
			p->drawLine( 0, middle, size, middle );
		else
			p->drawLine( middle, 0, middle, size );
	}
}